

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O0

SUNMemoryHelper SUNMemoryHelper_Sys(SUNContext sunctx)

{
  SUNMemoryHelper pSVar1;
  void *pvVar2;
  undefined8 in_RDI;
  SUNMemoryHelper helper;
  SUNContext sunctx_local_scope_;
  
  pSVar1 = (SUNMemoryHelper)SUNMemoryHelper_NewEmpty(in_RDI);
  pSVar1->ops->alloc = SUNMemoryHelper_Alloc_Sys;
  pSVar1->ops->allocstrided = SUNMemoryHelper_AllocStrided_Sys;
  pSVar1->ops->dealloc = SUNMemoryHelper_Dealloc_Sys;
  pSVar1->ops->copy = SUNMemoryHelper_Copy_Sys;
  pSVar1->ops->getallocstats = SUNMemoryHelper_GetAllocStats_Sys;
  pSVar1->ops->clone = SUNMemoryHelper_Clone_Sys;
  pSVar1->ops->destroy = SUNMemoryHelper_Destroy_Sys;
  pvVar2 = malloc(0x20);
  pSVar1->content = pvVar2;
  *(undefined8 *)pSVar1->content = 0;
  *(undefined8 *)((long)pSVar1->content + 8) = 0;
  *(undefined8 *)((long)pSVar1->content + 0x10) = 0;
  *(undefined8 *)((long)pSVar1->content + 0x18) = 0;
  return pSVar1;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_Sys(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNMemoryHelper helper;

  /* Allocate the helper */
  helper = SUNMemoryHelper_NewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Set the ops */
  helper->ops->alloc         = SUNMemoryHelper_Alloc_Sys;
  helper->ops->allocstrided  = SUNMemoryHelper_AllocStrided_Sys;
  helper->ops->dealloc       = SUNMemoryHelper_Dealloc_Sys;
  helper->ops->copy          = SUNMemoryHelper_Copy_Sys;
  helper->ops->getallocstats = SUNMemoryHelper_GetAllocStats_Sys;
  helper->ops->clone         = SUNMemoryHelper_Clone_Sys;
  helper->ops->destroy       = SUNMemoryHelper_Destroy_Sys;

  /* Attach content and ops */
  helper->content =
    (SUNMemoryHelper_Content_Sys*)malloc(sizeof(SUNMemoryHelper_Content_Sys));
  SUNAssertNull(helper->content, SUN_ERR_MALLOC_FAIL);

  SUNHELPER_CONTENT(helper)->num_allocations      = 0;
  SUNHELPER_CONTENT(helper)->num_deallocations    = 0;
  SUNHELPER_CONTENT(helper)->bytes_allocated      = 0;
  SUNHELPER_CONTENT(helper)->bytes_high_watermark = 0;

  return helper;
}